

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NameCatalog.cpp
# Opt level: O2

void __thiscall psy::C::NameCatalog::catalogUse_CORE<0ul,1ul>(NameCatalog *this,string *name)

{
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_unsigned_long>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_00;
  size_type sVar1;
  iterator __it;
  string asStack_58 [32];
  undefined1 local_38;
  size_type local_30;
  
  this_00 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_unsigned_long>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             *)currentEnclosure_abi_cxx11_(this);
  sVar1 = std::deque<const_psy::C::SyntaxNode_*,_std::allocator<const_psy::C::SyntaxNode_*>_>::size
                    ((deque<const_psy::C::SyntaxNode_*,_std::allocator<const_psy::C::SyntaxNode_*>_>
                      *)this);
  std::__cxx11::string::string(asStack_58,(string *)name);
  local_38 = 0;
  local_30 = sVar1;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<bool,unsigned_long>>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<bool,unsigned_long>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string,std::pair<bool,unsigned_long>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<bool,unsigned_long>>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<bool,unsigned_long>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)(this_00 + 1),asStack_58);
  std::__cxx11::string::~string(asStack_58);
  __it = std::
         _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_unsigned_long>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
         ::find(this_00,name);
  if ((__it.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_unsigned_long>_>,_true>
       ._M_cur != (__node_type *)0x0) &&
     (*(ulong *)((long)__it.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_unsigned_long>_>,_true>
                       ._M_cur + 0x30) < sVar1)) {
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_unsigned_long>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::erase(this_00,(const_iterator)
                    __it.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_unsigned_long>_>,_true>
                    ._M_cur);
  }
  return;
}

Assistant:

void NameCatalog::catalogUse_CORE(const std::string& name)
{
    auto enclosure = currentEnclosure();
    auto curDepth = enclosureStack_.size();
    auto& useAndDef = std::get<UseAndDef>(*enclosure);
    useAndDef.insert(std::make_pair(name, std::make_pair(false, curDepth)));
    auto& otherUseAndDef = std::get<OtherUseAndDef>(*enclosure);
    auto iter = otherUseAndDef.find(name);
    if (iter != otherUseAndDef.end() && curDepth > iter->second.second)
        otherUseAndDef.erase(iter);
}